

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O2

void guess_ca_certs(char *filename,X509_NAME *issuer_name,X509 **sigc,X509 **encc,X509 **issuer_cert
                   )

{
  byte bVar1;
  X509 *pXVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  X509 *pXVar6;
  X509_NAME *pXVar7;
  X509_NAME *b;
  int *piVar8;
  X509 **ppXVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  X509 *cert [20];
  char name [1024];
  
  uVar13 = 0;
  do {
    uVar11 = uVar13;
    if (uVar11 == 0x14) break;
    snprintf(name,0x3ff,"%s-%d",filename,uVar11 & 0xffffffff);
    pXVar6 = read_cert(name);
    cert[uVar11] = pXVar6;
    uVar13 = uVar11 + 1;
  } while (pXVar6 != (X509 *)0x0);
  *encc = cert[0];
  *sigc = cert[0];
  uVar13 = 0;
  do {
    if (uVar11 == uVar13) {
      for (uVar13 = 0; pcVar3 = pname, uVar11 != uVar13; uVar13 = uVar13 + 1) {
        pXVar2 = (X509 *)cert[uVar13];
        if (((pXVar2 != (X509 *)*sigc) && (pXVar2 != (X509 *)*encc)) &&
           (pXVar2 != (X509 *)*issuer_cert)) {
          X509_free(pXVar2);
        }
      }
      if (v_flag != 0) {
        if ((X509 *)*sigc != (X509 *)0x0) {
          pXVar7 = X509_get_subject_name((X509 *)*sigc);
          pcVar10 = X509_NAME_oneline(pXVar7,name,0x400);
          printf("%s: using RA certificate: %s\n",pcVar3,pcVar10);
        }
        pcVar3 = pname;
        if ((X509 *)*encc != (X509 *)0x0) {
          pXVar7 = X509_get_subject_name((X509 *)*encc);
          pcVar10 = X509_NAME_oneline(pXVar7,name,0x400);
          printf("%s: using RA encryption certificate: %s\n",pcVar3,pcVar10);
        }
        pcVar3 = pname;
        if ((X509 *)*issuer_cert != (X509 *)0x0) {
          pXVar7 = X509_get_subject_name((X509 *)*issuer_cert);
          pcVar10 = X509_NAME_oneline(pXVar7,name,0x400);
          printf("%s: using issuer certificate: %s\n",pcVar3,pcVar10);
        }
      }
      return;
    }
    pXVar2 = (X509 *)cert[uVar13];
    pXVar7 = X509_get_subject_name(pXVar2);
    uVar4 = 0;
    do {
      uVar12 = uVar4;
      if (uVar11 == uVar12) break;
      b = X509_get_issuer_name((X509 *)cert[uVar12]);
      iVar5 = X509_NAME_cmp(pXVar7,b);
      uVar4 = uVar12 + 1;
    } while (iVar5 != 0);
    if ((issuer_name != (X509_NAME *)0x0) &&
       (iVar5 = X509_NAME_cmp((X509_NAME *)issuer_name,pXVar7), iVar5 == 0)) {
      *issuer_cert = (X509 *)pXVar2;
    }
    if (uVar11 <= uVar12) {
      piVar8 = (int *)X509_get_ext_d2i(pXVar2,0x53,(int *)0x0,(int *)0x0);
      if ((piVar8 == (int *)0x0) || (*piVar8 < 1)) {
        *encc = (X509 *)pXVar2;
        ppXVar9 = sigc;
      }
      else {
        bVar1 = **(byte **)(piVar8 + 2);
        if ((char)bVar1 < '\0') {
          *sigc = (X509 *)pXVar2;
          bVar1 = **(byte **)(piVar8 + 2);
        }
        ppXVar9 = encc;
        if ((bVar1 & 0x20) == 0) goto LAB_0010d425;
      }
      *ppXVar9 = (X509 *)pXVar2;
    }
LAB_0010d425:
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void
guess_ca_certs(const char* filename, X509_NAME *issuer_name,
			   X509 **sigc, X509 **encc, X509 **issuer_cert)
{
	int ccnt, i, j;
	X509 *cert[20];

	ccnt = 0;
	/* read all certificates */
	while (ccnt < 20) {
		char name[1024];

		snprintf(name, sizeof(name)-1, "%s-%d", filename, ccnt);
		if (!(cert[ccnt] = read_cert(name)))
			break;

		ccnt++;
	}

	/* this is either NULL or the first certificate */
	*sigc = *encc = cert[0];

	for (i = 0; i < ccnt; i++) {
		X509_NAME *myname = X509_get_subject_name(cert[i]);
		int is_issuer = 0;

		/* the right CA is the final-one, either leaf or not */
		for (j = 0; j < ccnt; j++) {
			X509_NAME *issuer = X509_get_issuer_name(cert[j]);
			if (!X509_NAME_cmp(myname, issuer)) {
				is_issuer = 1;
				break;
			}
		}

		if (issuer_name != NULL && !X509_NAME_cmp(issuer_name, myname))
			*issuer_cert = cert[i];

		if (!is_issuer) {
			/* X509_get_key_usage(cert[i]) is not in older openssl */
			ASN1_BIT_STRING *usage = X509_get_ext_d2i(cert[i], NID_key_usage, NULL, NULL);
			if (usage && (usage->length > 0)) {
				if (usage->data[0] & KU_DIGITAL_SIGNATURE)
					*sigc = cert[i];
				if (usage->data[0] & KU_KEY_ENCIPHERMENT)
					*encc = cert[i];
			} else {
				/* no usability constraints */
				*sigc = *encc = cert[i];
			}
		}
	}

	/* release those we don't use */
	for (i = 0; i < ccnt; i++) {
		if (cert[i] != *sigc && cert[i] != *encc && cert[i] != *issuer_cert)
			X509_free(cert[i]);
	}

	if (v_flag) {
		char buffer[1024];

		if (*sigc)
			printf("%s: using RA certificate: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(*sigc),
						buffer, sizeof(buffer)));
		if (*encc)
			printf("%s: using RA encryption certificate: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(*encc),
						buffer, sizeof(buffer)));
		if (*issuer_cert)
			printf("%s: using issuer certificate: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(*issuer_cert),
						buffer, sizeof(buffer)));
	}

}